

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

date_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (OriginWidthConvertibleToMonthsTernaryOperator *this,interval_t bucket_width,date_t ts,
          date_t origin)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  date_t dVar6;
  int right;
  undefined1 auVar7 [12];
  date_t result;
  date_t local_44;
  string local_40;
  
  dVar6.days = bucket_width.micros._0_4_;
  bVar1 = Value::IsFinite<duckdb::date_t>(dVar6);
  if (bVar1) {
    iVar2 = EpochMonths<duckdb::date_t>(dVar6);
    iVar3 = EpochMonths<duckdb::date_t>(ts);
    right = (int)this;
    iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar2,iVar3 % right);
    iVar5 = iVar4 - iVar4 % right;
    if (iVar4 % right != 0 && iVar4 < 0) {
      iVar5 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar5,right);
    }
    iVar5 = iVar5 + iVar3 % right;
    iVar4 = iVar5 % 0xc;
    iVar2 = iVar4 + 1;
    if (iVar4 != 0 && -1 >= iVar5) {
      iVar2 = iVar4 + 0xd;
    }
    dVar6 = Date::FromDate((iVar4 == 0 || -1 < iVar5) + 0x7b1 + iVar5 / 0xc,iVar2,1);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(dVar6,&local_44,false);
    if (!bVar1) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_40,(duckdb *)(ulong)(uint)dVar6.days,(date_t)auVar7._8_4_);
      InvalidInputException::InvalidInputException(auVar7._0_8_,&local_40);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(dVar6,&local_44,false);
    if (!bVar1) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_40,(duckdb *)(ulong)(uint)dVar6.days,(date_t)auVar7._8_4_);
      InvalidInputException::InvalidInputException(auVar7._0_8_,&local_40);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (date_t)local_44.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			int32_t origin_months = EpochMonths(origin);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, origin_months));
		}